

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

CBlockIndex * __thiscall
node::BlockManager::AddToBlockIndex
          (BlockManager *this,CBlockHeader *block,CBlockIndex **best_header)

{
  int i;
  int iVar1;
  _Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> _Var2;
  __node_base_ptr p_Var3;
  CBlockIndex *pCVar4;
  uint32_t *puVar5;
  long lVar6;
  ulong uVar7;
  _Hash_node_base *p_Var8;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>,_bool>
  pVar9;
  CBlockIndex *pindexNew;
  undefined8 local_a8;
  CBlockIndex *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  uint256 local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash(&local_70,block);
  pVar9 = std::__detail::
          _Insert_base<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::try_emplace<uint256,CBlockHeader_const&>
                    ((_Insert_base<uint256,std::pair<uint256_const,CBlockIndex>,std::allocator<std::pair<uint256_const,CBlockIndex>>,std::__detail::_Select1st,std::equal_to<uint256>,BlockHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->m_block_index,(const_iterator)0x0,&local_70,block);
  _Var2 = pVar9.first.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur;
  if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar4 = (CBlockIndex *)
             ((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28);
  }
  else {
    local_90 = (CBlockIndex *)
               ((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                      _M_cur + 0x28);
    *(undefined4 *)
     ((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur +
     0xb4) = 0;
    *(long *)((long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                    _M_cur + 0x28) =
         (long)_Var2.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur +
         8;
    uVar7 = *(ulong *)(block->hashPrevBlock).super_base_blob<256U>.m_data._M_elems;
    p_Var8 = (_Hash_node_base *)0x0;
    p_Var3 = std::
             _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_block_index)._M_h,
                        uVar7 % (this->m_block_index)._M_h._M_bucket_count,&block->hashPrevBlock,
                        uVar7);
    if (p_Var3 != (__node_base_ptr)0x0) {
      p_Var8 = p_Var3->_M_nxt;
    }
    if (p_Var8 != (_Hash_node_base *)0x0) {
      local_90->pprev = (CBlockIndex *)(p_Var8 + 5);
      local_90->nHeight = *(int *)&p_Var8[8]._M_nxt + 1;
      CBlockIndex::BuildSkip(local_90);
    }
    pCVar4 = local_90->pprev;
    if (pCVar4 == (CBlockIndex *)0x0) {
      puVar5 = &local_90->nTime;
    }
    else {
      puVar5 = &pCVar4->nTimeMax;
      if (pCVar4->nTimeMax < local_90->nTime) {
        puVar5 = &local_90->nTime;
      }
    }
    local_90->nTimeMax = *puVar5;
    pCVar4 = local_90->pprev;
    if (pCVar4 == (CBlockIndex *)0x0) {
      local_a8 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78 = 0;
    }
    else {
      local_a8 = *(undefined8 *)(pCVar4->nChainWork).super_base_uint<256U>.pn;
      local_78 = *(undefined8 *)((pCVar4->nChainWork).super_base_uint<256U>.pn + 6);
      local_88 = *(undefined8 *)((pCVar4->nChainWork).super_base_uint<256U>.pn + 2);
      uStack_80 = *(undefined8 *)((pCVar4->nChainWork).super_base_uint<256U>.pn + 4);
    }
    GetBlockProof((arith_uint256 *)&local_70,local_90);
    local_50 = local_a8;
    uStack_48 = local_88;
    uStack_40 = uStack_80;
    uStack_38 = local_78;
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar7 = (ulong)*(uint *)(local_70.super_base_blob<256U>.m_data._M_elems + lVar6 * 4) +
              *(uint *)((long)&local_50 + lVar6 * 4) + uVar7;
      *(int *)((long)&local_50 + lVar6 * 4) = (int)uVar7;
      uVar7 = uVar7 >> 0x20;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    *(undefined8 *)((local_90->nChainWork).super_base_uint<256U>.pn + 4) = uStack_40;
    *(undefined8 *)((local_90->nChainWork).super_base_uint<256U>.pn + 6) = uStack_38;
    *(undefined8 *)(local_90->nChainWork).super_base_uint<256U>.pn = local_50;
    *(undefined8 *)((local_90->nChainWork).super_base_uint<256U>.pn + 2) = uStack_48;
    if ((local_90->nStatus & 0x66) == 0) {
      local_90->nStatus = local_90->nStatus & 0xffffff98 | 2;
    }
    if ((*best_header == (CBlockIndex *)0x0) ||
       (iVar1 = base_uint<256U>::CompareTo
                          (&((*best_header)->nChainWork).super_base_uint<256U>,
                           &(local_90->nChainWork).super_base_uint<256U>), iVar1 < 0)) {
      *best_header = local_90;
    }
    std::
    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
    ::_M_insert_unique<CBlockIndex*const&>
              ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                *)&this->m_dirty_blockindex,&local_90);
    pCVar4 = local_90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pCVar4;
}

Assistant:

CBlockIndex* BlockManager::AddToBlockIndex(const CBlockHeader& block, CBlockIndex*& best_header)
{
    AssertLockHeld(cs_main);

    auto [mi, inserted] = m_block_index.try_emplace(block.GetHash(), block);
    if (!inserted) {
        return &mi->second;
    }
    CBlockIndex* pindexNew = &(*mi).second;

    // We assign the sequence id to blocks only when the full data is available,
    // to avoid miners withholding blocks but broadcasting headers, to get a
    // competitive advantage.
    pindexNew->nSequenceId = 0;

    pindexNew->phashBlock = &((*mi).first);
    BlockMap::iterator miPrev = m_block_index.find(block.hashPrevBlock);
    if (miPrev != m_block_index.end()) {
        pindexNew->pprev = &(*miPrev).second;
        pindexNew->nHeight = pindexNew->pprev->nHeight + 1;
        pindexNew->BuildSkip();
    }
    pindexNew->nTimeMax = (pindexNew->pprev ? std::max(pindexNew->pprev->nTimeMax, pindexNew->nTime) : pindexNew->nTime);
    pindexNew->nChainWork = (pindexNew->pprev ? pindexNew->pprev->nChainWork : 0) + GetBlockProof(*pindexNew);
    pindexNew->RaiseValidity(BLOCK_VALID_TREE);
    if (best_header == nullptr || best_header->nChainWork < pindexNew->nChainWork) {
        best_header = pindexNew;
    }

    m_dirty_blockindex.insert(pindexNew);

    return pindexNew;
}